

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.c
# Opt level: O0

void gc_twist_derive(gc_twist *xd1,gc_twist *xd2,gc_acc_twist *r)

{
  gc_acc_twist *r_local;
  gc_twist *xd2_local;
  gc_twist *xd1_local;
  
  if (xd1 == (gc_twist *)0x0) {
    __assert_fail("xd1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/geometry.c"
                  ,0xc9,
                  "void gc_twist_derive(const struct gc_twist *, const struct gc_twist *, struct gc_acc_twist *)"
                 );
  }
  if (xd2 != (gc_twist *)0x0) {
    if (r != (gc_acc_twist *)0x0) {
      la_dcross_o((double *)xd1->angular_velocity,1,(double *)xd2->linear_velocity,1,
                  (double *)r->linear_acceleration,1);
      la_dcross_o((double *)xd1->linear_velocity,1,(double *)xd2->angular_velocity,1,
                  (double *)r->angular_acceleration,1);
      la_daxpy_ie(3,1.0,(double *)r->angular_acceleration,1,(double *)r->linear_acceleration,1);
      la_dcross_o((double *)xd1->angular_velocity,1,(double *)xd2->angular_velocity,1,
                  (double *)r->angular_acceleration,1);
      return;
    }
    __assert_fail("r",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/geometry.c"
                  ,0xcb,
                  "void gc_twist_derive(const struct gc_twist *, const struct gc_twist *, struct gc_acc_twist *)"
                 );
  }
  __assert_fail("xd2",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/geometry.c"
                ,0xca,
                "void gc_twist_derive(const struct gc_twist *, const struct gc_twist *, struct gc_acc_twist *)"
               );
}

Assistant:

void gc_twist_derive(
        const struct gc_twist *xd1,
        const struct gc_twist *xd2,
        struct gc_acc_twist *r)
{
    assert(xd1);
    assert(xd2);
    assert(r);

    // v_1 x w_2
    la_dcross_o(
            (double *)xd1->angular_velocity, 1,
            (double *)xd2->linear_velocity, 1,
            (double *)r->linear_acceleration, 1);

    // w_1 x v_2
    // reuse angular_acceleration as workspace
    la_dcross_o(
            (double *)xd1->linear_velocity, 1,
            (double *)xd2->angular_velocity, 1,
            (double *)r->angular_acceleration, 1);

    // v' = w_1 x v_2 + v_1 x w_2
    la_daxpy_ie(3,
            1.0, (double *)r->angular_acceleration, 1,
            (double *)r->linear_acceleration, 1);

    // w' = w_1 x w_2
    la_dcross_o(
            (double *)xd1->angular_velocity, 1,
            (double *)xd2->angular_velocity, 1,
            (double *)r->angular_acceleration, 1);
}